

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  ImDrawVert *pIVar2;
  ImVec4 *pIVar3;
  uint uVar4;
  ImDrawIdx IVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ImVec2 IVar12;
  ulong uVar13;
  undefined1 auVar14 [8];
  ImDrawIdx *pIVar15;
  byte bVar16;
  ImDrawIdx IVar17;
  undefined7 in_register_00000081;
  long lVar18;
  long lVar19;
  ImU32 IVar20;
  ImDrawIdx IVar21;
  ImDrawIdx IVar22;
  uint uVar23;
  float *pfVar24;
  ImDrawIdx IVar25;
  int iVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float afStack_a8 [2];
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  ImVec2 IStack_90;
  ImVec2 IStack_88;
  ImVec2 local_80;
  float local_78;
  int local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ImVec2 local_58;
  uint local_4c;
  ulong local_48;
  float local_40;
  undefined4 local_3c;
  float local_38;
  ImU32 local_34;
  
  IStack_90 = (ImVec2)local_98;
  if (1 < points_count) {
    auVar14 = (undefined1  [8])CONCAT44(0,points_count);
    local_58 = this->_Data->TexUvWhitePixel;
    local_60 = (ulong)(points_count - 1U);
    uVar6 = points_count - 1U;
    if (closed) {
      uVar6 = points_count;
    }
    local_40 = thickness;
    local_34 = col;
    if ((this->Flags & 1U) == 0) {
      uStack_a0 = 0x14a8ff;
      PrimReserve(this,uVar6 * 6,uVar6 * 4);
      if (0 < (int)uVar6) {
        fVar30 = local_40 * 0.5;
        local_98 = auVar14;
        IVar12 = local_58;
        uVar10 = 1;
        local_40 = fVar30;
        do {
          uVar8 = uVar10;
          if (auVar14 == (undefined1  [8])uVar10) {
            uVar8 = 0;
          }
          fVar34 = points[uVar8].x - points[uVar10 - 1].x;
          local_38 = points[uVar8].y - points[uVar10 - 1].y;
          fVar28 = fVar34 * fVar34 + local_38 * local_38;
          if (0.0 < fVar28) {
            if (fVar28 < 0.0) {
              local_48 = CONCAT44(local_48._4_4_,fVar34);
              uStack_a0 = 0x14a99c;
              fVar28 = sqrtf(fVar28);
              IVar12 = local_58;
              auVar14 = local_98;
              fVar30 = local_40;
              fVar34 = (float)local_48;
              col = local_34;
            }
            else {
              fVar28 = SQRT(fVar28);
            }
            fVar34 = fVar34 * (1.0 / fVar28);
            local_38 = local_38 * (1.0 / fVar28);
          }
          fVar34 = fVar34 * fVar30;
          fVar28 = local_38 * fVar30;
          pIVar2 = this->_VtxWritePtr;
          (pIVar2->pos).x = points[uVar10 - 1].x + fVar28;
          (pIVar2->pos).y = points[uVar10 - 1].y - fVar34;
          pIVar2->uv = IVar12;
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = col;
          pIVar2[1].pos.x = points[uVar8].x + fVar28;
          pIVar2[1].pos.y = points[uVar8].y - fVar34;
          pIVar2[1].uv = IVar12;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = col;
          pIVar2[2].pos.x = points[uVar8].x - fVar28;
          pIVar2[2].pos.y = points[uVar8].y + fVar34;
          pIVar2[2].uv = IVar12;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = col;
          pIVar2[3].pos.x = points[uVar10 - 1].x - fVar28;
          pIVar2[3].pos.y = fVar34 + points[uVar10 - 1].y;
          pIVar2[3].uv = IVar12;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[3].col = col;
          this->_VtxWritePtr = pIVar2 + 4;
          uVar23 = this->_VtxCurrentIdx;
          pIVar15 = this->_IdxWritePtr;
          IVar5 = (ImDrawIdx)uVar23;
          *pIVar15 = IVar5;
          pIVar15[1] = IVar5 + 1;
          pIVar15[2] = IVar5 + 2;
          pIVar15[3] = IVar5;
          pIVar15[4] = IVar5 + 2;
          pIVar15[5] = IVar5 + 3;
          this->_IdxWritePtr = pIVar15 + 6;
          this->_VtxCurrentIdx = uVar23 + 4;
          bVar27 = uVar10 != uVar6;
          uVar10 = uVar10 + 1;
        } while (bVar27);
      }
    }
    else {
      local_3c = (undefined4)CONCAT71(in_register_00000081,closed);
      local_78 = thickness;
      if (thickness <= 1.0) {
        local_78 = 1.0;
      }
      local_74 = (int)local_78;
      local_80.y = this->_FringeScale;
      bVar16 = local_80.y == 1.0 & local_74 < 0x3f & (byte)this->Flags >> 1 &
               local_78 - (float)local_74 <= 1e-05;
      iVar26 = 0x12;
      if (thickness <= local_80.y) {
        iVar26 = 0xc;
      }
      iVar11 = 6;
      if (bVar16 == 0) {
        iVar11 = iVar26;
      }
      local_38 = (float)CONCAT31(local_38._1_3_,bVar16);
      if (bVar16 == 1) {
        local_4c = points_count * 2;
        iVar26 = 3;
      }
      else {
        local_4c = points_count * 3;
        if (local_80.y < thickness) {
          local_4c = points_count * 4;
        }
        iVar26 = (uint)(local_80.y < thickness) * 2 + 3;
      }
      uStack_a0 = 0x14abb2;
      local_70 = (ulong)uVar6;
      PrimReserve(this,iVar11 * uVar6,local_4c);
      lVar19 = -((ulong)(uint)(iVar26 * points_count) * 8 + 0xf & 0xfffffffffffffff0);
      pfVar24 = (float *)(local_98 + lVar19);
      local_68 = (ulong)auVar14;
      uVar10 = (ulong)(uint)points_count;
      local_48 = uVar10;
      if (0 < (int)local_70) {
        uVar13 = local_70 & 0xffffffff;
        uVar8 = 1;
        do {
          uVar7 = uVar8;
          if (uVar10 == uVar8) {
            uVar7 = 0;
          }
          local_98._0_4_ = points[uVar7].x - points[uVar8 - 1].x;
          local_80.x = points[uVar7].y - points[uVar8 - 1].y;
          fVar30 = (float)local_98._0_4_ * (float)local_98._0_4_ + local_80.x * local_80.x;
          if (0.0 < fVar30) {
            if (fVar30 < 0.0) {
              _local_98 = ZEXT416((uint)local_98._0_4_);
              *(undefined8 *)(local_98 + lVar19 + -8) = 0x14ac5a;
              fVar30 = sqrtf(fVar30);
              uVar10 = local_48;
            }
            else {
              fVar30 = SQRT(fVar30);
            }
            local_98._0_4_ = (float)local_98._0_4_ * (1.0 / fVar30);
            local_80.x = local_80.x * (1.0 / fVar30);
          }
          *(float *)(local_98 + uVar8 * 8 + lVar19 + -8) = local_80.x;
          *(float *)(local_98 + uVar8 * 8 + lVar19 + -4) = -(float)local_98._0_4_;
          bVar27 = uVar8 != uVar13;
          uVar8 = uVar8 + 1;
        } while (bVar27);
      }
      pfVar1 = pfVar24 + uVar10 * 2;
      if ((char)local_3c == '\0') {
        *(undefined8 *)(pfVar24 + (local_60 & 0xffffffff) * 2) = *(undefined8 *)(pfVar1 + -4);
      }
      IVar20 = local_34;
      IVar12 = local_58;
      uVar6 = local_34 & 0xffffff;
      if ((local_40 <= local_80.y | local_38._0_1_) == 1) {
        fVar30 = local_80.y;
        if (local_38._0_1_ != 0) {
          fVar30 = local_78 * 0.5 + 1.0;
        }
        if ((char)local_3c == '\0') {
          fVar34 = *pfVar24;
          fVar28 = *(float *)(local_98 + lVar19 + 4);
          fVar31 = points->x;
          fVar32 = points->y;
          *pfVar1 = fVar34 * fVar30 + fVar31;
          pfVar1[1] = fVar28 * fVar30 + fVar32;
          pfVar1[2] = fVar31 - fVar34 * fVar30;
          pfVar1[3] = fVar32 - fVar28 * fVar30;
          uVar10 = local_60 & 0xffffffff;
          fVar34 = points[uVar10].x;
          fVar28 = points[uVar10].y;
          uVar8 = (ulong)(uint)((int)local_60 * 2);
          *(ulong *)(pfVar1 + uVar8 * 2) =
               CONCAT44(*(float *)(local_98 + uVar10 * 8 + lVar19 + 4) * fVar30 + fVar28,
                        pfVar24[uVar10 * 2] * fVar30 + fVar34);
          *(ulong *)(pfVar1 + uVar8 * 2 + 2) =
               CONCAT44(fVar28 - *(float *)(local_98 + uVar10 * 8 + lVar19 + 4) * fVar30,
                        fVar34 - pfVar24[uVar10 * 2] * fVar30);
        }
        if (0 < (int)local_70) {
          uVar9 = (uint)local_38 & 0xff;
          pIVar15 = this->_IdxWritePtr;
          uVar10 = 1;
          uVar23 = this->_VtxCurrentIdx;
          do {
            uVar8 = uVar10 & 0xffffffff;
            uVar4 = uVar23 + (uVar9 ^ 3);
            if (local_48 == uVar10) {
              uVar8 = 0;
              uVar4 = this->_VtxCurrentIdx;
            }
            fVar28 = (*(float *)(local_98 + uVar10 * 8 + lVar19 + -8) + pfVar24[uVar8 * 2]) * 0.5;
            fVar31 = (*(float *)(local_98 + uVar10 * 8 + lVar19 + -4) +
                     *(float *)(local_98 + uVar8 * 8 + lVar19 + 4)) * 0.5;
            fVar32 = fVar28 * fVar28 + fVar31 * fVar31;
            fVar34 = 0.5;
            if (0.5 <= fVar32) {
              fVar34 = fVar32;
            }
            fVar29 = fVar28 * (1.0 / fVar34) * fVar30;
            uVar13 = (ulong)(uint)((int)uVar8 * 2);
            fVar28 = points[uVar8].x;
            pfVar1[uVar13 * 2] = fVar28 + fVar29;
            fVar32 = points[uVar8].y;
            fVar34 = (1.0 / fVar34) * fVar31 * fVar30;
            pfVar1[uVar13 * 2 + 1] = fVar32 + fVar34;
            pfVar1[uVar13 * 2 + 2] = fVar28 - fVar29;
            pfVar1[uVar13 * 2 + 3] = fVar32 - fVar34;
            IVar21 = (ImDrawIdx)uVar4;
            *pIVar15 = IVar21;
            IVar5 = (ImDrawIdx)uVar23;
            pIVar15[1] = IVar5;
            if (local_38._0_1_ == '\0') {
              pIVar15[2] = IVar5 + 2;
              pIVar15[3] = IVar5 + 2;
              pIVar15[4] = IVar21 + 2;
              pIVar15[5] = IVar21;
              pIVar15[6] = IVar21 + 1;
              pIVar15[7] = IVar5 + 1;
              pIVar15[8] = IVar5;
              pIVar15[9] = IVar5;
              pIVar15[10] = IVar21;
              pIVar15[0xb] = IVar21 + 1;
              lVar18 = 0x18;
            }
            else {
              pIVar15[2] = IVar5 + 1;
              pIVar15[3] = IVar21 + 1;
              pIVar15[4] = IVar5 + 1;
              pIVar15[5] = IVar21;
              lVar18 = 0xc;
            }
            pIVar15 = (ImDrawIdx *)((long)pIVar15 + lVar18);
            this->_IdxWritePtr = pIVar15;
            bVar27 = uVar10 != (local_70 & 0xffffffff);
            uVar10 = uVar10 + 1;
            uVar23 = uVar4;
          } while (bVar27);
        }
        if (local_38._0_1_ == '\0') {
          uVar10 = 1;
          if (1 < (int)local_68) {
            uVar10 = local_68 & 0xffffffff;
          }
          lVar19 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar19);
            this->_VtxWritePtr->uv = local_58;
            pIVar2 = this->_VtxWritePtr;
            pIVar2->col = local_34;
            pIVar2[1].pos = *(ImVec2 *)((long)pfVar24 + lVar19 * 2 + local_48 * 8);
            this->_VtxWritePtr[1].uv = local_58;
            pIVar2 = this->_VtxWritePtr;
            pIVar2[1].col = uVar6;
            pIVar2[2].pos = *(ImVec2 *)((long)pfVar24 + lVar19 * 2 + local_48 * 8 + 8);
            this->_VtxWritePtr[2].uv = local_58;
            pIVar2 = this->_VtxWritePtr;
            pIVar2[2].col = uVar6;
            this->_VtxWritePtr = pIVar2 + 3;
            lVar19 = lVar19 + 8;
          } while (uVar10 * 8 != lVar19);
        }
        else {
          pIVar3 = this->_Data->TexUvLines;
          lVar19 = (long)local_74;
          fVar30 = pIVar3[lVar19].x;
          fVar34 = pIVar3[lVar19].y;
          uVar10 = 1;
          if (1 < (int)local_68) {
            uVar10 = local_68 & 0xffffffff;
          }
          fVar28 = pIVar3[lVar19].z;
          fVar31 = pIVar3[lVar19].w;
          lVar19 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)pfVar24 + lVar19 + local_48 * 8);
            pIVar2 = this->_VtxWritePtr;
            (pIVar2->uv).x = fVar30;
            (pIVar2->uv).y = fVar34;
            pIVar2 = this->_VtxWritePtr;
            pIVar2->col = local_34;
            pIVar2[1].pos = *(ImVec2 *)((long)pfVar24 + lVar19 + local_48 * 8 + 8);
            pIVar2 = this->_VtxWritePtr;
            pIVar2[1].uv.x = fVar28;
            pIVar2[1].uv.y = fVar31;
            pIVar2 = this->_VtxWritePtr;
            pIVar2[1].col = local_34;
            this->_VtxWritePtr = pIVar2 + 2;
            lVar19 = lVar19 + 0x10;
          } while (uVar10 * 0x10 != lVar19);
        }
      }
      else {
        fVar30 = (local_78 - local_80.y) * 0.5;
        if ((char)local_3c == '\0') {
          fVar31 = local_80.y + fVar30;
          fVar33 = fVar31 * *pfVar24;
          fVar35 = fVar31 * *(float *)(local_98 + lVar19 + 4);
          fVar34 = points->x;
          fVar28 = points->y;
          fVar32 = *pfVar24 * fVar30;
          fVar29 = *(float *)(local_98 + lVar19 + 4) * fVar30;
          *pfVar1 = fVar33 + fVar34;
          pfVar1[1] = fVar35 + fVar28;
          pfVar1[2] = fVar32 + fVar34;
          pfVar1[3] = fVar29 + fVar28;
          pfVar1[4] = fVar34 - fVar32;
          pfVar1[5] = fVar28 - fVar29;
          pfVar1[6] = fVar34 - fVar33;
          pfVar1[7] = fVar28 - fVar35;
          uVar8 = local_60 & 0xffffffff;
          fVar34 = points[uVar8].x;
          fVar28 = points[uVar8].y;
          uVar13 = (ulong)(uint)((int)local_60 << 2);
          *(ulong *)(pfVar1 + uVar13 * 2) =
               CONCAT44(*(float *)(local_98 + uVar8 * 8 + lVar19 + 4) * fVar31 + fVar28,
                        pfVar24[uVar8 * 2] * fVar31 + fVar34);
          *(ulong *)(pfVar1 + uVar13 * 2 + 2) =
               CONCAT44(*(float *)(local_98 + uVar8 * 8 + lVar19 + 4) * fVar30 + fVar28,
                        pfVar24[uVar8 * 2] * fVar30 + fVar34);
          *(ulong *)(pfVar1 + uVar13 * 2 + 4) =
               CONCAT44(fVar28 - *(float *)(local_98 + uVar8 * 8 + lVar19 + 4) * fVar30,
                        fVar34 - pfVar24[uVar8 * 2] * fVar30);
          *(ulong *)(pfVar1 + uVar13 * 2 + 6) =
               CONCAT44(fVar28 - fVar31 * *(float *)(local_98 + uVar8 * 8 + lVar19 + 4),
                        fVar34 - pfVar24[uVar8 * 2] * fVar31);
        }
        if (0 < (int)local_70) {
          pIVar15 = this->_IdxWritePtr;
          uVar8 = 1;
          uVar23 = this->_VtxCurrentIdx;
          do {
            uVar13 = uVar8 & 0xffffffff;
            if (uVar10 == uVar8) {
              uVar13 = 0;
            }
            fVar28 = (*(float *)(local_98 + uVar8 * 8 + lVar19 + -8) + pfVar24[uVar13 * 2]) * 0.5;
            fVar31 = (*(float *)(local_98 + uVar8 * 8 + lVar19 + -4) +
                     *(float *)(local_98 + uVar13 * 8 + lVar19 + 4)) * 0.5;
            fVar32 = fVar28 * fVar28 + fVar31 * fVar31;
            fVar34 = 0.5;
            if (0.5 <= fVar32) {
              fVar34 = fVar32;
            }
            uVar9 = uVar23 + 4;
            if (uVar10 == uVar8) {
              uVar9 = this->_VtxCurrentIdx;
            }
            fVar28 = fVar28 * (1.0 / fVar34);
            fVar31 = (1.0 / fVar34) * fVar31;
            fVar33 = (local_80.y + fVar30) * fVar28;
            fVar29 = (local_80.y + fVar30) * fVar31;
            fVar28 = fVar28 * fVar30;
            uVar10 = (ulong)(uint)((int)uVar13 << 2);
            fVar34 = points[uVar13].x;
            fVar31 = fVar31 * fVar30;
            pfVar1[uVar10 * 2] = fVar34 + fVar33;
            fVar32 = points[uVar13].y;
            pfVar1[uVar10 * 2 + 1] = fVar32 + fVar29;
            pfVar1[uVar10 * 2 + 2] = fVar34 + fVar28;
            pfVar1[uVar10 * 2 + 3] = fVar32 + fVar31;
            pfVar1[uVar10 * 2 + 4] = fVar34 - fVar28;
            pfVar1[uVar10 * 2 + 5] = fVar32 - fVar31;
            pfVar1[uVar10 * 2 + 6] = fVar34 - fVar33;
            IVar5 = (ImDrawIdx)uVar9;
            IVar22 = IVar5 + 1;
            pfVar1[uVar10 * 2 + 7] = fVar32 - fVar29;
            *pIVar15 = IVar22;
            IVar21 = (ImDrawIdx)uVar23;
            IVar25 = IVar21 + 2;
            pIVar15[1] = IVar21 + 1;
            pIVar15[2] = IVar25;
            pIVar15[3] = IVar25;
            IVar17 = IVar5 + 2;
            pIVar15[4] = IVar17;
            pIVar15[5] = IVar22;
            pIVar15[6] = IVar22;
            pIVar15[7] = IVar21 + 1;
            pIVar15[8] = IVar21;
            pIVar15[9] = IVar21;
            pIVar15[10] = IVar5;
            pIVar15[0xb] = IVar22;
            pIVar15[0xc] = IVar17;
            pIVar15[0xd] = IVar25;
            pIVar15[0xe] = IVar21 + 3;
            pIVar15[0xf] = IVar21 + 3;
            pIVar15[0x10] = IVar5 + 3;
            pIVar15[0x11] = IVar17;
            pIVar15 = pIVar15 + 0x12;
            bVar27 = uVar8 != (local_70 & 0xffffffff);
            uVar8 = uVar8 + 1;
            uVar10 = local_48;
            uVar23 = uVar9;
          } while (bVar27);
          this->_IdxWritePtr = pIVar15;
          IVar12 = local_58;
          IVar20 = local_34;
        }
        uVar8 = 1;
        if (1 < (int)local_68) {
          uVar8 = local_68 & 0xffffffff;
        }
        lVar19 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)pfVar24 + lVar19 + uVar10 * 8);
          this->_VtxWritePtr->uv = IVar12;
          pIVar2 = this->_VtxWritePtr;
          pIVar2->col = uVar6;
          pIVar2[1].pos = *(ImVec2 *)((long)pfVar24 + lVar19 + uVar10 * 8 + 8);
          this->_VtxWritePtr[1].uv = IVar12;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[1].col = IVar20;
          pIVar2[2].pos = *(ImVec2 *)((long)pfVar24 + lVar19 + uVar10 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = IVar12;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[2].col = IVar20;
          pIVar2[3].pos = *(ImVec2 *)((long)pfVar24 + lVar19 + uVar10 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = IVar12;
          pIVar2 = this->_VtxWritePtr;
          pIVar2[3].col = uVar6;
          this->_VtxWritePtr = pIVar2 + 4;
          lVar19 = lVar19 + 0x20;
        } while (uVar8 * 0x20 != lVar19);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (local_4c & 0xffff);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}